

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O2

void renderer_NUMERIC_AS_SIGN_RENDERER_WITH_COMBINED_AUX
               (wchar_t *label,wchar_t nlabel,wchar_t *vals,wchar_t *auxvals,wchar_t n,
               ui_entry_details *details,renderer_info *info)

{
  wchar_t x;
  wchar_t y;
  wchar_t n_00;
  wchar_t *pwVar1;
  int iVar2;
  loc_conflict lVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  wchar_t ac;
  wchar_t vc;
  wchar_t *local_90;
  wchar_t local_88;
  wchar_t local_84;
  wchar_t *local_80;
  wchar_t *local_78;
  loc_conflict local_70;
  ulong local_68;
  ui_entry_combiner_funcs_conflict combiner;
  ui_entry_combiner_state_conflict cst;
  
  uVar9 = 7;
  if (details->alternate_color_first == false) {
    uVar9 = 0;
  }
  local_90 = auxvals;
  local_80 = label;
  local_78 = vals;
  if (((L'\x15' < info->ncolors) && (L'\t' < info->nlabcolors)) && (L'\n' < info->nsym)) {
    lVar3.y = 0;
    lVar3.x = (details->value_position).x;
    uVar8 = (ulong)(uint)(details->value_position).y;
    local_84 = nlabel;
    iVar2 = ui_entry_combiner_get_funcs(info->combiner_index,(ui_entry_combiner_funcs *)&combiner);
    if (iVar2 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-entry-renderers.c"
                    ,0x43f,
                    "void renderer_NUMERIC_AS_SIGN_RENDERER_WITH_COMBINED_AUX(const wchar_t *, int, const int *, const int *, int, const struct ui_entry_details *, const struct renderer_info *)"
                   );
    }
    uVar7 = 0;
    local_68 = 0;
    local_88 = n;
    if (L'\0' < n) {
      local_68 = (ulong)(uint)n;
    }
    for (; pwVar1 = local_78, n_00 = local_84, local_68 != uVar7; uVar7 = uVar7 + 1) {
      uVar6 = 0;
      local_70 = lVar3;
      (*combiner.init_func)(local_78[uVar7],L'\0',&cst);
      (*combiner.accum_func)(local_90[uVar7],L'\0',&cst);
      (*combiner.finish_func)(&cst);
      lVar3 = local_70;
      if (((pwVar1[uVar7] != L'\x7fffffff') &&
          ((pwVar1[uVar7] != L'\0' || (uVar6 = 0, local_90[uVar7] != L'\x7fffffff')))) &&
         (uVar6 = 1, cst.accum != L'\x7ffffffe')) {
        iVar2 = (uint)(local_90[uVar7] != L'\0') * 2;
        if (L'\0' < local_90[uVar7]) {
          iVar2 = 1;
        }
        iVar5 = 8;
        if (cst.accum == L'\0') {
          iVar5 = 2;
        }
        if (L'\0' < cst.accum) {
          iVar5 = 5;
        }
        uVar6 = (ulong)(uint)(iVar5 + iVar2);
      }
      Term_putch(local_70.x,(wchar_t)uVar8,info->colors[uVar9 + (int)uVar6],info->symbols[uVar6]);
      lVar3 = loc_sum((loc_conflict)((ulong)lVar3 & 0xffffffff | uVar8 << 0x20),
                      (loc_conflict)details->position_step);
      uVar8 = (ulong)lVar3 >> 0x20;
      uVar9 = uVar9 ^ 0xb;
    }
    if ((L'\0' < local_84) || (details->show_combined == true)) {
      (*combiner.vec_func)(local_88,local_78,local_90,&vc,&ac);
      if (L'\0' < n_00) {
        if (details->known_rune == true) {
          (*combiner.init_func)(vc,L'\0',&cst);
          (*combiner.accum_func)(ac,L'\0',&cst);
          (*combiner.finish_func)(&cst);
          if (cst.accum < L'\x7ffffffe') {
            uVar8 = (ulong)((uint)(ac != L'\0') * 2);
            if (L'\0' < ac) {
              uVar8 = 1;
            }
            uVar7 = 7;
            if (cst.accum == L'\0') {
              uVar7 = 1;
            }
            uVar6 = 4;
            if (cst.accum < L'\x01') {
              uVar6 = uVar7;
            }
            lVar4 = uVar6 + uVar8;
          }
          else {
            lVar4 = 1;
          }
        }
        else {
          lVar4 = 0;
        }
        x = (details->label_position).x;
        y = (details->label_position).y;
        if (details->vertical_label == true) {
          for (uVar8 = 0; (uint)n_00 != uVar8; uVar8 = uVar8 + 1) {
            Term_putch(x,y + (int)uVar8,info->label_colors[lVar4],local_80[uVar8]);
          }
        }
        else {
          safe_queue_chars(x,y,n_00,info->label_colors[lVar4],local_80);
        }
      }
      if (details->show_combined == true) {
        show_combined_generic(info,details,vc,ac);
      }
    }
    return;
  }
  __assert_fail("info->ncolors >= 22 && info->nlabcolors >= 10 && info->nsym >= 11",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-entry-renderers.c"
                ,0x43c,
                "void renderer_NUMERIC_AS_SIGN_RENDERER_WITH_COMBINED_AUX(const wchar_t *, int, const int *, const int *, int, const struct ui_entry_details *, const struct renderer_info *)"
               );
}

Assistant:

static void renderer_NUMERIC_AS_SIGN_RENDERER_WITH_COMBINED_AUX(
	const wchar_t *label,
	int nlabel,
	const int *vals,
	const int *auxvals,
	int n,
	const struct ui_entry_details *details,
	const struct renderer_info *info)
{
	struct loc p = details->value_position;
	int color_offset = (details->alternate_color_first) ? 7 : 0;
	struct ui_entry_combiner_funcs combiner;
	int vc, ac;
	int i;

	/* Check for defaults that are too short in list-ui-entry-renders.h. */
	assert(info->ncolors >= 22 && info->nlabcolors >= 10
		&& info->nsym >= 11);

	if (ui_entry_combiner_get_funcs(info->combiner_index, &combiner)) {
		assert(0);
	}

	for (i = 0; i < n; ++i) {
		struct ui_entry_combiner_state cst;
		int palette_index;

		(*combiner.init_func)(vals[i], 0, &cst);
		(*combiner.accum_func)(auxvals[i], 0, &cst);
		(*combiner.finish_func)(&cst);
		if (vals[i] == UI_ENTRY_UNKNOWN_VALUE || (vals[i] == 0
				&& auxvals[i] == UI_ENTRY_UNKNOWN_VALUE)) {
			palette_index = 0;
		} else if (cst.accum == UI_ENTRY_VALUE_NOT_PRESENT) {
			palette_index = 1;
		} else {
			palette_index =
				((cst.accum > 0) ?
					5 : ((cst.accum < 0) ? 8 : 2))
				+ ((auxvals[i] > 0) ?
					1 : ((auxvals[i] < 0) ? 2 : 0));
		}
		Term_putch(p.x, p.y,
			info->colors[palette_index + color_offset],
			info->symbols[palette_index]);
		p = loc_sum(p, details->position_step);
		color_offset ^= 11;
	}

	if (nlabel <= 0 && !details->show_combined) {
		return;
	}

	(*combiner.vec_func)(n, vals, auxvals, &vc, &ac);

	if (nlabel > 0) {
		int palette_index;

		if (!details->known_rune) {
			palette_index = 0;
		} else {
			struct ui_entry_combiner_state cst;

			(*combiner.init_func)(vc, 0, &cst);
			(*combiner.accum_func)(ac, 0, &cst);
			(*combiner.finish_func)(&cst);
			if (cst.accum == UI_ENTRY_UNKNOWN_VALUE
					|| cst.accum == UI_ENTRY_VALUE_NOT_PRESENT) {
				palette_index = 1;
			} else {
				palette_index =
					((cst.accum > 0) ? 4 :
						((cst.accum < 0) ? 7 : 1))
					+ ((ac > 0) ? 1 : ((ac < 0) ? 2 : 0));
			}
		}
		if (details->vertical_label) {
			p = details->label_position;
			for (i = 0; i < nlabel; ++i) {
				Term_putch(p.x, p.y,
					info->label_colors[palette_index],
					label[i]);
				p.y += 1;
			}
		} else {
			safe_queue_chars(details->label_position.x,
				details->label_position.y, nlabel,
				info->label_colors[palette_index], label);
		}
	}

	if (details->show_combined) {
		show_combined_generic(info, details, vc, ac);
	}
}